

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O0

bool __thiscall cmCTestP4::DescribeParser::ProcessLine(DescribeParser *this)

{
  ulong uVar1;
  DescribeParser *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    switch(this->Section) {
    case SectionHeader:
      DoHeaderLine(this);
      break;
    case SectionBody:
      DoBodyLine(this);
      break;
    case SectionDiffHeader:
      break;
    case SectionDiff:
      DoDiffLine(this);
      break;
    case SectionCount:
    }
  }
  else {
    NextSection(this);
  }
  return true;
}

Assistant:

bool ProcessLine() CM_OVERRIDE
  {
    if (this->Line.empty()) {
      this->NextSection();
    } else {
      switch (this->Section) {
        case SectionHeader:
          this->DoHeaderLine();
          break;
        case SectionBody:
          this->DoBodyLine();
          break;
        case SectionDiffHeader:
          break; // nothing to do
        case SectionDiff:
          this->DoDiffLine();
          break;
        case SectionCount:
          break; // never happens
      }
    }
    return true;
  }